

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall mkvparser::Tags::Parse(Tags *this)

{
  long stop;
  IMkvReader *pReader;
  long lVar1;
  long lVar2;
  long lVar3;
  longlong pos;
  longlong size;
  longlong id;
  long local_48;
  long local_40;
  long local_38;
  
  pReader = this->m_pSegment->m_pReader;
  local_48 = this->m_start;
  stop = this->m_size + local_48;
  if (0 < this->m_size) {
    do {
      lVar3 = ParseElementHeader(pReader,&local_48,stop,&local_38,&local_40);
      lVar2 = local_40;
      lVar1 = local_48;
      if (lVar3 < 0) {
        return lVar3;
      }
      if (local_40 != 0) {
        if ((local_38 == 0x7373) && (lVar3 = ParseTag(this,local_48,local_40), lVar3 < 0)) {
          return lVar3;
        }
        local_48 = lVar1 + lVar2;
        if (stop < local_48) {
          return -2;
        }
      }
    } while (local_48 < stop);
  }
  return (ulong)(local_48 == stop) * 2 + -2;
}

Assistant:

long Tags::Parse() {
  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long pos = m_start;  // payload start
  const long long stop = pos + m_size;  // payload stop

  while (pos < stop) {
    long long id, size;

    long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)
      return status;

    if (size == 0)  // 0 length tag, read another
      continue;

    if (id == libwebm::kMkvTag) {
      status = ParseTag(pos, size);

      if (status < 0)
        return status;
    }

    pos += size;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  return 0;
}